

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_ameth.c
# Opt level: O2

int pkey_bits_gost(EVP_PKEY *pk)

{
  int iVar1;
  
  if (pk != (EVP_PKEY *)0x0) {
    iVar1 = EVP_PKEY_get_base_id();
    if (iVar1 == 0x32b) {
      return 0x100;
    }
    if (iVar1 == 0x331) {
      return 0x100;
    }
    if (iVar1 == 0x3d3) {
      return 0x100;
    }
    if (iVar1 == 0x3d4) {
      return 0x200;
    }
  }
  return -1;
}

Assistant:

static int pkey_bits_gost(const EVP_PKEY *pk)
{
    if (!pk)
        return -1;

    switch (EVP_PKEY_base_id(pk)) {
    case NID_id_GostR3410_2001:
    case NID_id_GostR3410_2001DH:
    case NID_id_GostR3410_2012_256:
        return 256;
    case NID_id_GostR3410_2012_512:
        return 512;
    }

    return -1;
}